

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExperimentResult.cpp
# Opt level: O1

shared_ptr<celero::UserDefinedMeasurementCollector> __thiscall
celero::ExperimentResult::getUserDefinedMeasurements(ExperimentResult *this)

{
  _Tuple_impl<0UL,_celero::ExperimentResult::Impl_*,_std::default_delete<celero::ExperimentResult::Impl>_>
  _Var1;
  size_type sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  shared_ptr<celero::UserDefinedMeasurementCollector> sVar4;
  shared_ptr<celero::UserDefinedMeasurementCollector> sVar5;
  
  _Var1.super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::ExperimentResult::Impl,_std::default_delete<celero::ExperimentResult::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::ExperimentResult::Impl_*,_std::default_delete<celero::ExperimentResult::Impl>_>
       .super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false>;
  _Var3._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)_Var1.super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false>.
                        _M_head_impl + 0x70);
  (in_RDI->collected)._M_h._M_buckets = (__buckets_ptr)_Var3._M_pi;
  sVar2 = *(size_type *)
           ((long)_Var1.super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false>._M_head_impl
           + 0x78);
  (in_RDI->collected)._M_h._M_bucket_count = sVar2;
  if (sVar2 != 0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
      sVar4.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar4.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = in_RDI;
      return (shared_ptr<celero::UserDefinedMeasurementCollector>)
             sVar4.
             super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    LOCK();
    *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
    UNLOCK();
  }
  sVar5.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<celero::UserDefinedMeasurementCollector>)
         sVar5.
         super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UserDefinedMeasurementCollector> ExperimentResult::getUserDefinedMeasurements() const
{
	return this->pimpl->udmCollector;
}